

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

TypeVector * __thiscall wabt::Type::GetInlineVector(TypeVector *__return_storage_ptr__,Type *this)

{
  uint uVar1;
  
  if (I32 < this->enum_) {
    __assert_fail("!IsIndex()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/type.h"
                  ,0x7c,"TypeVector wabt::Type::GetInlineVector() const");
  }
  uVar1 = this->enum_ + 0x40;
  if (uVar1 < 0x40) {
    if ((0xf801810000000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((ulong)uVar1 != 0) goto LAB_00158fdd;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)__return_storage_ptr__,this,
                 this + 1);
    }
    return __return_storage_ptr__;
  }
LAB_00158fdd:
  abort();
}

Assistant:

bool IsIndex() const { return static_cast<int32_t>(enum_) >= 0; }